

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# producer.cpp
# Opt level: O2

void __thiscall
pcplusplus::threads::producer_threads::producer_threads
          (producer_threads *this,size_t target,size_t count,mutex *mtx,C_V *canPro,C_V *canCon,
          queue<long> *buff)

{
  time_t __seedval;
  allocator<char> local_19;
  
  generic_threads::generic_threads(&this->super_generic_threads,target,count,mtx,canPro,canCon,buff)
  ;
  (this->super_generic_threads)._vptr_generic_threads = (_func_int **)&PTR_thread_routine_00107c50;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&this->thread_type,"producer",&local_19);
  std::ofstream::open((char *)&(this->super_generic_threads).logfile,0x1050e1);
  __seedval = time((time_t *)0x0);
  srand48(__seedval);
  return;
}

Assistant:

producer_threads::producer_threads(size_t target, size_t count, std::mutex *mtx, C_V *canPro, C_V *canCon, queue<long> *buff)
	: generic_threads(target, count, mtx, canPro, canCon, buff)
    {
	try{
	    logfile.open(PRODUCER_LOG_FILENAME, std::fstream::out | std::fstream::trunc);
	}
	catch(const std::ofstream::failure& e){
	    std::cerr << PRODUCER_LOG_FILENAME " could not be opened for writing" << std::endl;
	}
	srand48(std::time(nullptr));
    }